

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::BasicResetCase
          (BasicResetCase *this,EglTestContext *eglTestCtx,char *name,char *description,
          Params *params)

{
  pointer pcVar1;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  undefined8 local_38;
  
  local_88._0_8_ = local_88 + 0x10;
  pcVar1 = (params->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + (params->m_name)._M_string_length);
  pcVar1 = (params->m_description)._M_dataplus._M_p;
  local_68._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (params->m_description)._M_string_length);
  local_38._0_4_ = params->m_readWriteType;
  local_38._4_4_ = params->m_fixedFunctionType;
  local_58[1]._0_4_ = params->m_robustAccessType;
  local_58[1]._4_4_ = params->m_contextResetType;
  local_58[1]._8_4_ = params->m_shaderType;
  local_58[1]._12_4_ = params->m_resourceType;
  ContextResetCase::ContextResetCase
            (&this->super_ContextResetCase,eglTestCtx,name,description,(Params *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != local_58) {
    operator_delete(local_68._M_p,local_58[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_02156c20;
  return;
}

Assistant:

BasicResetCase (EglTestContext& eglTestCtx, const char* name, const char* description, Params params)
		: ContextResetCase (eglTestCtx, name, description, params) {}